

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

void Eigen::internal::
     set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>>
               (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                *begin,__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                       *end,SparseMatrix<double,_0,_int> *mat,int Options)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  Index IVar4;
  Index cols;
  Index IVar5;
  Scalar *pSVar6;
  pointer pTVar7;
  double *pdVar8;
  int *piVar9;
  Scalar *pSVar10;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  local_a0;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  it_1;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  local_90;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  it;
  undefined1 local_78 [8];
  Matrix<int,__1,_1,_0,__1,_1> wi;
  SparseMatrix<double,_1,_int> trMat;
  int Options_local;
  SparseMatrix<double,_0,_int> *mat_local;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  *end_local;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  *begin_local;
  
  trMat.m_data.m_allocatedSize._4_4_ = Options;
  ignore_unused_variable<int>((int *)((long)&trMat.m_data.m_allocatedSize + 4));
  IVar4 = SparseMatrix<double,_0,_int>::rows(mat);
  cols = SparseMatrix<double,_0,_int>::cols(mat);
  SparseMatrix<double,_1,_int>::SparseMatrix
            ((SparseMatrix<double,_1,_int> *)
             &wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,IVar4,
             cols);
  bVar3 = __gnu_cxx::operator!=(begin,end);
  if (bVar3) {
    IVar5 = SparseMatrix<double,_1,_int>::outerSize
                      ((SparseMatrix<double,_1,_int> *)
                       &wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_78,(long)IVar5);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_78);
    local_90 = (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                )begin->_M_current;
    while (bVar3 = __gnu_cxx::operator!=(&local_90,end), bVar3) {
      pTVar7 = __gnu_cxx::
               __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
               ::operator->(&local_90);
      piVar9 = Triplet<double,_int>::row(pTVar7);
      bVar3 = false;
      if (-1 < *piVar9) {
        pTVar7 = __gnu_cxx::
                 __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                 ::operator->(&local_90);
        piVar9 = Triplet<double,_int>::row(pTVar7);
        iVar2 = *piVar9;
        IVar4 = SparseMatrix<double,_0,_int>::rows(mat);
        bVar3 = false;
        if (iVar2 < IVar4) {
          pTVar7 = __gnu_cxx::
                   __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                   ::operator->(&local_90);
          piVar9 = Triplet<double,_int>::col(pTVar7);
          bVar3 = false;
          if (-1 < *piVar9) {
            pTVar7 = __gnu_cxx::
                     __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                     ::operator->(&local_90);
            piVar9 = Triplet<double,_int>::col(pTVar7);
            iVar2 = *piVar9;
            IVar4 = SparseMatrix<double,_0,_int>::cols(mat);
            bVar3 = iVar2 < IVar4;
          }
        }
      }
      if (!bVar3) {
        __assert_fail("it->row()>=0 && it->row()<mat.rows() && it->col()>=0 && it->col()<mat.cols()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                      ,0x3b8,
                      "void Eigen::internal::set_from_triplets(const InputIterator &, const InputIterator &, SparseMatrixType &, int) [InputIterator = __gnu_cxx::__normal_iterator<Eigen::Triplet<double> *, std::vector<Eigen::Triplet<double>>>, SparseMatrixType = Eigen::SparseMatrix<double>]"
                     );
      }
      pTVar7 = __gnu_cxx::
               __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
               ::operator->(&local_90);
      piVar9 = Triplet<double,_int>::row(pTVar7);
      pSVar6 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_78,
                          (long)*piVar9);
      *pSVar6 = *pSVar6 + 1;
      __gnu_cxx::
      __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
      ::operator++(&local_90);
    }
    it_1._M_current._4_4_ = 0;
    SparseMatrix<double,1,int>::reserve<Eigen::Matrix<int,_1,1,0,_1,1>>
              ((SparseMatrix<double,1,int> *)
               &wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (Matrix<int,__1,_1,_0,__1,_1> *)local_78,(Scalar *)((long)&it_1._M_current + 4));
    local_a0 = (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                )begin->_M_current;
    while (bVar3 = __gnu_cxx::operator!=(&local_a0,end), bVar3) {
      pTVar7 = __gnu_cxx::
               __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
               ::operator->(&local_a0);
      pdVar8 = Triplet<double,_int>::value(pTVar7);
      dVar1 = *pdVar8;
      pTVar7 = __gnu_cxx::
               __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
               ::operator->(&local_a0);
      piVar9 = Triplet<double,_int>::row(pTVar7);
      IVar5 = *piVar9;
      pTVar7 = __gnu_cxx::
               __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
               ::operator->(&local_a0);
      piVar9 = Triplet<double,_int>::col(pTVar7);
      pSVar10 = SparseMatrix<double,_1,_int>::insertBackUncompressed
                          ((SparseMatrix<double,_1,_int> *)
                           &wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
                            .m_rows,IVar5,*piVar9);
      *pSVar10 = dVar1;
      __gnu_cxx::
      __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
      ::operator++(&local_a0);
    }
    SparseMatrix<double,_1,_int>::sumupDuplicates
              ((SparseMatrix<double,_1,_int> *)
               &wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_78);
  }
  SparseMatrix<double,0,int>::operator=
            ((SparseMatrix<double,0,int> *)mat,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_> *)
             &wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  SparseMatrix<double,_1,_int>::~SparseMatrix
            ((SparseMatrix<double,_1,_int> *)
             &wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  return;
}

Assistant:

void set_from_triplets(const InputIterator& begin, const InputIterator& end, SparseMatrixType& mat, int Options = 0)
{
  EIGEN_UNUSED_VARIABLE(Options);
  enum { IsRowMajor = SparseMatrixType::IsRowMajor };
  typedef typename SparseMatrixType::Scalar Scalar;
  typedef typename SparseMatrixType::Index Index;
  SparseMatrix<Scalar,IsRowMajor?ColMajor:RowMajor,Index> trMat(mat.rows(),mat.cols());

  if(begin!=end)
  {
    // pass 1: count the nnz per inner-vector
    Matrix<Index,Dynamic,1> wi(trMat.outerSize());
    wi.setZero();
    for(InputIterator it(begin); it!=end; ++it)
    {
      eigen_assert(it->row()>=0 && it->row()<mat.rows() && it->col()>=0 && it->col()<mat.cols());
      wi(IsRowMajor ? it->col() : it->row())++;
    }

    // pass 2: insert all the elements into trMat
    trMat.reserve(wi);
    for(InputIterator it(begin); it!=end; ++it)
      trMat.insertBackUncompressed(it->row(),it->col()) = it->value();

    // pass 3:
    trMat.sumupDuplicates();
  }

  // pass 4: transposed copy -> implicit sorting
  mat = trMat;
}